

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_lights.cxx
# Opt level: O0

void __thiscall xray_re::xr_scene_lights::save(xr_scene_lights *this,xr_writer *w)

{
  xr_writer *this_00;
  size_type value;
  unsigned_short local_1a;
  xr_writer *local_18;
  xr_writer *w_local;
  xr_scene_lights *this_local;
  
  local_18 = w;
  w_local = (xr_writer *)this;
  xr_scene_objects::save(&this->super_xr_scene_objects,w);
  local_1a = 0;
  xr_writer::w_chunk<unsigned_short>(local_18,0x1001,&local_1a);
  xr_writer::w_chunk<unsigned_int>(local_18,0x1004,&this->m_flags);
  xr_writer::open_chunk(local_18,0x1006);
  xr_writer::w_u8(local_18,'\0');
  xr_writer::w_fvector2(local_18,&this->m_sun);
  xr_writer::close_chunk(local_18);
  xr_writer::open_chunk(local_18,0x1003);
  this_00 = local_18;
  value = std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>::size
                    (&this->m_controls);
  xr_writer::w_size_u32(this_00,value);
  xr_writer::close_chunk(local_18);
  xr_writer::open_chunk(local_18,0x1002);
  xr_writer::w_seq<std::vector<xray_re::xr_token,std::allocator<xray_re::xr_token>>,write_token>
            (local_18,&this->m_controls);
  xr_writer::close_chunk(local_18);
  return;
}

Assistant:

void xr_scene_lights::save(xr_writer& w) const
{
	xr_scene_objects::save(w);
	w.w_chunk<uint16_t>(TOOLS_CHUNK_VERSION, 0);
	w.w_chunk<uint32_t>(LIGHTS_CHUNK_COMMON_FLAGS, m_flags);

	w.open_chunk(LIGHTS_CHUNK_COMMON_SUN);
	w.w_u8(0);
	w.w_fvector2(m_sun);
	w.close_chunk();

	w.open_chunk(LIGHTS_CHUNK_COMMON_COUNT);
	w.w_size_u32(m_controls.size());
	w.close_chunk();

	w.open_chunk(LIGHTS_CHUNK_COMMON_CONTROLS);
	w.w_seq(m_controls, write_token());
	w.close_chunk();
}